

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::dragLeaveEvent(QGraphicsView *this,QDragLeaveEvent *event)

{
  long lVar1;
  MouseButtons buttons;
  KeyboardModifiers modifiers;
  DropActions actions;
  DropAction DVar2;
  QMimeData *data;
  QWidget *pQVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  QPointF local_58;
  undefined1 local_48 [12];
  char cStack_3c;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
      (*(long *)(lVar1 + 0x498) != 0)) && ((*(byte *)(lVar1 + 0x300) & 1) != 0)) {
    if (*(long *)(lVar1 + 0x520) == 0) {
      dragLeaveEvent();
    }
    else {
      local_38.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneDragDropEvent::QGraphicsSceneDragDropEvent
                ((QGraphicsSceneDragDropEvent *)local_48,GraphicsSceneDragLeave);
      QVar5 = QGraphicsSceneDragDropEvent::scenePos
                        (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      local_58.yp = QVar5.yp;
      local_58.xp = QVar5.xp;
      QGraphicsSceneDragDropEvent::setScenePos((QGraphicsSceneDragDropEvent *)local_48,&local_58);
      local_58.xp = (qreal)QGraphicsSceneDragDropEvent::screenPos
                                     (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setScreenPos
                ((QGraphicsSceneDragDropEvent *)local_48,(QPoint *)&local_58);
      buttons = QGraphicsSceneDragDropEvent::buttons
                          (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setButtons((QGraphicsSceneDragDropEvent *)local_48,buttons);
      modifiers = QGraphicsSceneDragDropEvent::modifiers
                            (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setModifiers((QGraphicsSceneDragDropEvent *)local_48,modifiers);
      actions = QGraphicsSceneDragDropEvent::possibleActions
                          (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setPossibleActions
                ((QGraphicsSceneDragDropEvent *)local_48,actions);
      DVar2 = QGraphicsSceneDragDropEvent::proposedAction
                        (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setProposedAction((QGraphicsSceneDragDropEvent *)local_48,DVar2);
      DVar2 = QGraphicsSceneDragDropEvent::dropAction
                        (*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520));
      QGraphicsSceneDragDropEvent::setDropAction((QGraphicsSceneDragDropEvent *)local_48,DVar2);
      data = QGraphicsSceneDragDropEvent::mimeData(*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520))
      ;
      QGraphicsSceneDragDropEvent::setMimeData((QGraphicsSceneDragDropEvent *)local_48,data);
      pQVar3 = QGraphicsSceneEvent::widget(*(QGraphicsSceneEvent **)(lVar1 + 0x520));
      QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_48,pQVar3);
      pQVar3 = QGraphicsSceneDragDropEvent::source(*(QGraphicsSceneDragDropEvent **)(lVar1 + 0x520))
      ;
      QGraphicsSceneDragDropEvent::setSource((QGraphicsSceneDragDropEvent *)local_48,pQVar3);
      if (*(long **)(lVar1 + 0x520) != (long *)0x0) {
        (**(code **)(**(long **)(lVar1 + 0x520) + 8))();
      }
      *(undefined8 *)(lVar1 + 0x520) = 0;
      if ((*(long *)(lVar1 + 0x490) == 0) || (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0)) {
        pQVar4 = (QObject *)0x0;
      }
      else {
        pQVar4 = *(QObject **)(lVar1 + 0x498);
      }
      QCoreApplication::sendEvent(pQVar4,(QEvent *)local_48);
      if (cStack_3c == '\x01') {
        (**(code **)(*(long *)event + 0x10))(event,1);
      }
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::dragLeaveEvent(QDragLeaveEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;
    if (!d->lastDragDropEvent) {
        qWarning("QGraphicsView::dragLeaveEvent: drag leave received before drag enter");
        return;
    }

    // Generate a scene event.
    QGraphicsSceneDragDropEvent sceneEvent(QEvent::GraphicsSceneDragLeave);
    sceneEvent.setScenePos(d->lastDragDropEvent->scenePos());
    sceneEvent.setScreenPos(d->lastDragDropEvent->screenPos());
    sceneEvent.setButtons(d->lastDragDropEvent->buttons());
    sceneEvent.setModifiers(d->lastDragDropEvent->modifiers());
    sceneEvent.setPossibleActions(d->lastDragDropEvent->possibleActions());
    sceneEvent.setProposedAction(d->lastDragDropEvent->proposedAction());
    sceneEvent.setDropAction(d->lastDragDropEvent->dropAction());
    sceneEvent.setMimeData(d->lastDragDropEvent->mimeData());
    sceneEvent.setWidget(d->lastDragDropEvent->widget());
    sceneEvent.setSource(d->lastDragDropEvent->source());
    delete d->lastDragDropEvent;
    d->lastDragDropEvent = nullptr;

    // Send it to the scene.
    QCoreApplication::sendEvent(d->scene, &sceneEvent);

    // Accept the originating event if the scene accepted the scene event.
    if (sceneEvent.isAccepted())
        event->setAccepted(true);
}